

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O0

void ncnn::binary_op_vector_broadcast_b<ncnn::BinaryOp_x86_avx512_functor::binary_op_min>
               (float *ptr,float *ptr1,float *outptr,int size,int elempack)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  float *pfVar4;
  int in_ECX;
  float *in_RDX;
  undefined1 (*in_RSI) [64];
  undefined1 (*in_RDI) [64];
  int in_R8D;
  __m128 _outp_2;
  __m128 _p_2;
  __m256 _outp_1;
  __m256 _p_1;
  __m512 _outp;
  __m512 _p;
  __m512 _b_512;
  __m256 _b_256;
  __m128 _b_128;
  int i;
  float b;
  binary_op_min op;
  undefined1 local_500 [64];
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 local_450;
  undefined8 uStack_448;
  undefined1 local_440 [32];
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined1 local_400 [64];
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 uStack_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 uStack_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 local_310;
  undefined8 uStack_308;
  int local_2fc;
  float local_2f8;
  undefined1 local_2f1 [5];
  int local_2ec;
  float *local_2e8;
  undefined1 (*local_2d8) [64];
  undefined1 (*local_2d0) [64];
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  float *local_278;
  undefined1 (*local_270) [64];
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  float *local_228;
  undefined1 (*local_220) [64];
  undefined8 local_210;
  undefined8 uStack_208;
  float *local_1f8;
  float local_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  float local_1d4;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 *local_1a0;
  undefined8 *local_198;
  undefined1 *local_190;
  undefined8 *local_188;
  undefined8 *local_180;
  undefined1 *local_178;
  undefined8 *local_170;
  undefined8 *local_168;
  undefined1 *local_160;
  float *local_158;
  undefined1 (*local_150) [64];
  undefined1 *local_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 uStack_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  
  local_2f8 = *(float *)*in_RSI;
  local_2fc = 0;
  if (in_R8D == 4) {
    local_470 = *(undefined8 *)*in_RSI;
    uStack_468 = *(undefined8 *)(*in_RSI + 8);
  }
  else {
    local_470 = CONCAT44(local_2f8,local_2f8);
    uStack_468 = CONCAT44(local_2f8,local_2f8);
    local_1f0 = local_2f8;
    fStack_1ec = local_2f8;
    fStack_1e8 = local_2f8;
    fStack_1e4 = local_2f8;
    local_1d4 = local_2f8;
  }
  local_310 = local_470;
  uStack_308 = uStack_468;
  if (in_R8D == 8) {
    local_4a0 = *(undefined8 *)*in_RSI;
    uStack_498 = *(undefined8 *)(*in_RSI + 8);
    uStack_490 = *(undefined8 *)(*in_RSI + 0x10);
    uStack_488 = *(undefined8 *)(*in_RSI + 0x18);
  }
  else {
    local_1d0 = local_470;
    uStack_1c8 = uStack_468;
    local_4a0 = local_470;
    uStack_498 = uStack_468;
    uStack_490 = local_470;
    uStack_488 = uStack_468;
  }
  local_340 = local_4a0;
  uStack_338 = uStack_498;
  uStack_330 = uStack_490;
  uStack_328 = uStack_488;
  if (in_R8D == 0x10) {
    local_500 = *in_RSI;
  }
  else {
    local_1c0 = local_4a0;
    uStack_1b8 = uStack_498;
    uStack_1b0 = uStack_490;
    uStack_1a8 = uStack_488;
    auVar2._8_8_ = uStack_498;
    auVar2._0_8_ = local_4a0;
    auVar2._16_8_ = uStack_490;
    auVar2._24_8_ = uStack_488;
    local_500 = vinsertf64x4_avx512f
                          (ZEXT3264(CONCAT824(uStack_488,
                                              CONCAT816(uStack_490,CONCAT88(uStack_498,local_4a0))))
                           ,auVar2,1);
  }
  local_380 = local_500._0_8_;
  uStack_378 = local_500._8_8_;
  uStack_370 = local_500._16_8_;
  uStack_368 = local_500._24_8_;
  uStack_360 = local_500._32_8_;
  uStack_358 = local_500._40_8_;
  uStack_350 = local_500._48_8_;
  uStack_348 = local_500._56_8_;
  local_2e8 = in_RDX;
  local_2d8 = in_RDI;
  for (; local_2fc + 0xf < in_ECX; local_2fc = local_2fc + 0x10) {
    local_2d0 = local_2d8;
    local_3c0 = *(undefined8 *)*local_2d8;
    uStack_3b8 = *(undefined8 *)(*local_2d8 + 8);
    uStack_3b0 = *(undefined8 *)(*local_2d8 + 0x10);
    uStack_3a8 = *(undefined8 *)(*local_2d8 + 0x18);
    uStack_3a0 = *(undefined8 *)(*local_2d8 + 0x20);
    uStack_398 = *(undefined8 *)(*local_2d8 + 0x28);
    uStack_390 = *(undefined8 *)(*local_2d8 + 0x30);
    uStack_388 = *(undefined8 *)(*local_2d8 + 0x38);
    local_190 = local_2f1;
    local_198 = &local_3c0;
    local_1a0 = &local_380;
    local_140 = local_500._0_8_;
    uStack_138 = local_500._8_8_;
    uStack_130 = local_500._16_8_;
    uStack_128 = local_500._24_8_;
    uStack_120 = local_500._32_8_;
    uStack_118 = local_500._40_8_;
    uStack_110 = local_500._48_8_;
    uStack_108 = local_500._56_8_;
    local_400 = vminps_avx512f(*local_2d8,local_500);
    local_278 = local_2e8;
    local_2c0 = local_400._0_8_;
    uStack_2b8 = local_400._8_8_;
    uStack_2b0 = local_400._16_8_;
    uStack_2a8 = local_400._24_8_;
    uStack_2a0 = local_400._32_8_;
    uStack_298 = local_400._40_8_;
    uStack_290 = local_400._48_8_;
    uStack_288 = local_400._56_8_;
    *(undefined8 *)local_2e8 = local_400._0_8_;
    *(undefined8 *)(local_2e8 + 2) = local_400._8_8_;
    *(undefined8 *)(local_2e8 + 4) = local_400._16_8_;
    *(undefined8 *)(local_2e8 + 6) = local_400._24_8_;
    *(undefined8 *)(local_2e8 + 8) = local_400._32_8_;
    *(undefined8 *)(local_2e8 + 10) = local_400._40_8_;
    *(undefined8 *)(local_2e8 + 0xc) = local_400._48_8_;
    *(undefined8 *)(local_2e8 + 0xe) = local_400._56_8_;
    local_2d8 = local_2d8 + 1;
    local_2e8 = local_2e8 + 0x10;
    local_100 = local_3c0;
    uStack_f8 = uStack_3b8;
    uStack_f0 = uStack_3b0;
    uStack_e8 = uStack_3a8;
    uStack_e0 = uStack_3a0;
    uStack_d8 = uStack_398;
    uStack_d0 = uStack_390;
    uStack_c8 = uStack_388;
  }
  for (; local_2fc + 7 < in_ECX; local_2fc = local_2fc + 8) {
    local_270 = local_2d8;
    local_420 = *(undefined8 *)*local_2d8;
    uStack_418 = *(undefined8 *)(*local_2d8 + 8);
    uStack_410 = *(undefined8 *)(*local_2d8 + 0x10);
    uStack_408 = *(undefined8 *)(*local_2d8 + 0x18);
    local_178 = local_2f1;
    local_180 = &local_420;
    local_188 = &local_340;
    local_c0 = local_4a0;
    uStack_b8 = uStack_498;
    uStack_b0 = uStack_490;
    uStack_a8 = uStack_488;
    auVar3._8_8_ = uStack_498;
    auVar3._0_8_ = local_4a0;
    auVar3._16_8_ = uStack_490;
    auVar3._24_8_ = uStack_488;
    local_440 = vminps_avx(*(undefined1 (*) [32])*local_2d8,auVar3);
    local_228 = local_2e8;
    local_260 = local_440._0_8_;
    uStack_258 = local_440._8_8_;
    uStack_250 = local_440._16_8_;
    uStack_248 = local_440._24_8_;
    *(undefined8 *)local_2e8 = local_440._0_8_;
    *(undefined8 *)(local_2e8 + 2) = local_440._8_8_;
    *(undefined8 *)(local_2e8 + 4) = local_440._16_8_;
    *(undefined8 *)(local_2e8 + 6) = local_440._24_8_;
    local_2d8 = (undefined1 (*) [64])(*local_2d8 + 0x20);
    local_2e8 = local_2e8 + 8;
    local_a0 = local_420;
    uStack_98 = uStack_418;
    uStack_90 = uStack_410;
    uStack_88 = uStack_408;
  }
  for (; local_2ec = in_ECX, local_2fc + 3 < in_ECX; local_2fc = local_2fc + 4) {
    local_220 = local_2d8;
    local_450 = *(undefined8 *)*local_2d8;
    uStack_448 = *(undefined8 *)(*local_2d8 + 8);
    local_160 = local_2f1;
    local_168 = &local_450;
    local_170 = &local_310;
    local_70 = local_470;
    uStack_68 = uStack_468;
    auVar1._8_8_ = uStack_468;
    auVar1._0_8_ = local_470;
    auVar1 = vminps_avx(*(undefined1 (*) [16])*local_2d8,auVar1);
    local_1f8 = local_2e8;
    local_460 = auVar1._0_8_;
    local_210 = local_460;
    uStack_458 = auVar1._8_8_;
    uStack_208 = uStack_458;
    *(undefined8 *)local_2e8 = local_460;
    *(undefined8 *)(local_2e8 + 2) = uStack_458;
    local_2d8 = (undefined1 (*) [64])(*local_2d8 + 0x10);
    local_2e8 = local_2e8 + 4;
    local_60 = local_450;
    uStack_58 = uStack_448;
  }
  for (; local_2fc < local_2ec; local_2fc = local_2fc + 1) {
    local_148 = local_2f1;
    local_150 = local_2d8;
    local_158 = &local_2f8;
    pfVar4 = std::min<float>((float *)local_2d8,local_158);
    *local_2e8 = *pfVar4;
    local_2d8 = (undefined1 (*) [64])(*local_2d8 + 4);
    local_2e8 = local_2e8 + 1;
  }
  return;
}

Assistant:

static void binary_op_vector_broadcast_b(const float* ptr, const float* ptr1, float* outptr, int size, int elempack)
{
    const Op op;

    const float b = *ptr1;

    int i = 0;
#if __SSE2__
    __m128 _b_128 = (elempack == 4) ? _mm_loadu_ps(ptr1) : _mm_set1_ps(b);
#if __AVX__
    __m256 _b_256 = (elempack == 8) ? _mm256_loadu_ps(ptr1) : _mm256_insertf128_ps(_mm256_castps128_ps256(_b_128), _b_128, 1);
#if __AVX512F__
    __m512 _b_512 = (elempack == 16) ? _mm512_loadu_ps(ptr1) : _mm512_insertf32x8(_mm512_castps256_ps512(_b_256), _b_256, 1);
    for (; i + 15 < size; i += 16)
    {
        __m512 _p = _mm512_loadu_ps(ptr);
        __m512 _outp = op.func_pack16(_p, _b_512);
        _mm512_storeu_ps(outptr, _outp);
        ptr += 16;
        outptr += 16;
    }
#endif // __AVX512F__
    for (; i + 7 < size; i += 8)
    {
        __m256 _p = _mm256_loadu_ps(ptr);
        __m256 _outp = op.func_pack8(_p, _b_256);
        _mm256_storeu_ps(outptr, _outp);
        ptr += 8;
        outptr += 8;
    }
#endif // __AVX__
    for (; i + 3 < size; i += 4)
    {
        __m128 _p = _mm_loadu_ps(ptr);
        __m128 _outp = op.func_pack4(_p, _b_128);
        _mm_storeu_ps(outptr, _outp);
        ptr += 4;
        outptr += 4;
    }
#endif // __SSE2__
    for (; i < size; i++)
    {
        *outptr = op.func(*ptr, b);
        ptr += 1;
        outptr += 1;
    }
}